

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  bool bVar1;
  int iVar2;
  DescriptorProto *message_type_00;
  FieldDescriptorProto *field;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  FileDescriptorProto *value_local;
  DescriptorProto *message_type_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_2c = 0;
  while( true ) {
    iVar2 = DescriptorProto::nested_type_size(message_type);
    if (iVar2 <= local_2c) {
      local_30 = 0;
      while( true ) {
        iVar2 = DescriptorProto::extension_size(message_type);
        if (iVar2 <= local_30) {
          return true;
        }
        field = DescriptorProto::extension(message_type,local_30);
        bVar1 = AddExtension(this,field,value);
        if (!bVar1) break;
        local_30 = local_30 + 1;
      }
      return false;
    }
    message_type_00 = DescriptorProto::nested_type(message_type,local_2c);
    bVar1 = AddNestedExtensions(this,message_type_00,value);
    if (!bVar1) break;
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(message_type.nested_type(i), value)) return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(message_type.extension(i), value)) return false;
  }
  return true;
}